

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void gen_dup_i32(TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_i32 out,TCGv_i32 in)

{
  TCGv_i32 in_local;
  TCGv_i32 out_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  if (vece == 0) {
    tcg_gen_ext8u_i32_tricore(tcg_ctx,out,in);
    tcg_gen_muli_i32_tricore(tcg_ctx,out,out,0x1010101);
  }
  else if (vece == 1) {
    tcg_gen_deposit_i32_tricore(tcg_ctx,out,in,in,0x10,0x10);
  }
  else if (vece == 2) {
    tcg_gen_mov_i32(tcg_ctx,out,in);
  }
  return;
}

Assistant:

static void gen_dup_i32(TCGContext *tcg_ctx, unsigned vece, TCGv_i32 out, TCGv_i32 in)
{
    switch (vece) {
    case MO_8:
        tcg_gen_ext8u_i32(tcg_ctx, out, in);
        tcg_gen_muli_i32(tcg_ctx, out, out, 0x01010101);
        break;
    case MO_16:
        tcg_gen_deposit_i32(tcg_ctx, out, in, in, 16, 16);
        break;
    case MO_32:
        tcg_gen_mov_i32(tcg_ctx, out, in);
        break;
    default:
        // g_assert_not_reached();
        break;
    }
}